

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxSelect(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *val,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *stab,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *bestDelta,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *max,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *update,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *lowBound,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *upBound,int start,int incr)

{
  Type TVar1;
  uint uVar2;
  pointer pnVar3;
  int *piVar4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  SPxId *pSVar6;
  int iVar7;
  fpclass_type fVar8;
  fpclass_type fVar9;
  long lVar10;
  ulong uVar11;
  pointer pnVar12;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  uint *puVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  uint *puVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  uint *puVar21;
  pointer pnVar22;
  bool bVar23;
  byte bVar24;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  uint local_2b4;
  uint local_2b0;
  undefined1 local_288 [32];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [13];
  undefined3 uStack_21b;
  int iStack_218;
  bool bStack_214;
  undefined8 local_210;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  pointer local_1f8;
  pointer local_1f0;
  cpp_dec_float<200U,_int,_void> *local_1e8;
  pointer local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [13];
  undefined3 uStack_16b;
  int iStack_168;
  bool bStack_164;
  undefined8 local_160;
  uint *local_150;
  long local_148;
  uint *local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [13];
  undefined3 uStack_cb;
  int iStack_c8;
  bool bStack_c4;
  undefined8 local_c0;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar24 = 0;
  local_c0 = 0x1c00000000;
  local_138 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_cb = 0;
  iStack_c8 = 0;
  bStack_c4 = false;
  TVar1 = (this->
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_type;
  if (TVar1 == LEAVE) {
    bVar23 = false;
  }
  else {
    bVar23 = ((this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->theRep == ROW;
  }
  iVar7 = (update->thedelta).super_IdxSet.num;
  if (iVar7 <= start) {
    return 0xffffffff;
  }
  local_1f0 = (upBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1f8 = (lowBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (update->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar4 = (update->thedelta).super_IdxSet.idx;
  pnVar22 = (update->thedelta).
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_140 = (uint *)(piVar4 + iVar7);
  puVar21 = (uint *)(piVar4 + start);
  local_150 = (stab->m_backend).data._M_elems + 1;
  local_148 = (long)incr << 2;
  local_2b0 = 0xffffffff;
  local_2b4 = 0xffffffff;
  local_200 = val;
  local_1e8 = &best->m_backend;
  local_1e0 = pnVar22;
  do {
    uVar2 = *puVar21;
    pnVar12 = pnVar22 + (int)uVar2;
    pcVar16 = &local_b0;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pcVar16->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar24 * -2 + 1) * 4);
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar24 * -2 + 1) * 4);
    }
    local_b0.exp = pnVar22[(int)uVar2].m_backend.exp;
    local_b0.neg = pnVar22[(int)uVar2].m_backend.neg;
    local_b0.fpclass = pnVar22[(int)uVar2].m_backend.fpclass;
    local_b0.prec_elem = pnVar22[(int)uVar2].m_backend.prec_elem;
    if (TVar1 == LEAVE) {
      pSVar5 = (this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      if (this->iscoid == true) {
        pDVar13 = (pSVar5->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.costat;
      }
      else {
        pDVar13 = (pSVar5->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.stat;
      }
      if (pSVar5->theRep * pDVar13->data[(int)uVar2] < 1) goto LAB_005bd2dd;
    }
    else {
LAB_005bd2dd:
      if (bVar23) {
        pSVar5 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        pSVar6 = (pSVar5->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data;
        if (pSVar6[(int)uVar2].super_DataKey.info < 1) goto LAB_005bd348;
        SPxColId::SPxColId((SPxColId *)local_288,pSVar6 + (int)uVar2);
        iVar7 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                ::number(&(pSVar5->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set,(DataKey *)local_288);
        pnVar22 = local_1e0;
        if ((pSVar5->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedesc.colstat.data[iVar7] == P_FIXED) goto LAB_005bd906;
        fVar8 = local_b0.fpclass;
      }
      else {
LAB_005bd348:
        fVar8 = local_b0.fpclass;
      }
      fVar9 = (stab->m_backend).fpclass;
      if (fVar9 == cpp_dec_float_NaN || fVar8 == cpp_dec_float_NaN) {
LAB_005bd44f:
        pnVar14 = stab;
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_288;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar16->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar24 * -2 + 1) * 4);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar24 * -8 + 4);
        }
        iStack_218 = (stab->m_backend).exp;
        bStack_214 = (stab->m_backend).neg;
        local_210 = CONCAT44((stab->m_backend).prec_elem,fVar9);
        if (local_288._0_4_ != 0 || fVar9 != cpp_dec_float_finite) {
          bStack_214 = (bool)(bStack_214 ^ 1);
        }
        if (((fVar9 != cpp_dec_float_NaN) && (local_b0.fpclass != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_b0,(cpp_dec_float<200U,_int,_void> *)local_288), iVar7 < 0)) {
          pcVar16 = &local_1f8[(int)uVar2].m_backend;
          local_160._0_4_ = cpp_dec_float_finite;
          local_160._4_4_ = 0x1c;
          local_1d8 = (undefined1  [16])0x0;
          local_1c8 = (undefined1  [16])0x0;
          local_1b8 = (undefined1  [16])0x0;
          local_1a8 = (undefined1  [16])0x0;
          local_198 = (undefined1  [16])0x0;
          local_188 = (undefined1  [16])0x0;
          local_178 = SUB1613((undefined1  [16])0x0,0);
          uStack_16b = 0;
          iStack_168 = 0;
          bStack_164 = false;
          if ((cpp_dec_float<200U,_int,_void> *)local_1d8 == &pnVar3[(int)uVar2].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_1d8,pcVar16);
            if (local_1d8._0_4_ != 0 || (fpclass_type)local_160 != cpp_dec_float_finite) {
              bStack_164 = (bool)(bStack_164 ^ 1);
            }
          }
          else {
            if ((cpp_dec_float<200U,_int,_void> *)local_1d8 != pcVar16) {
              pcVar15 = pcVar16;
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pcVar18->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
                pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar24 * -8 + 4)
                ;
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar24 * -8 + 4)
                ;
              }
              iStack_168 = pcVar16->exp;
              bStack_164 = pcVar16->neg;
              local_160._0_4_ = pcVar16->fpclass;
              local_160._4_4_ = pcVar16->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_1d8,&pnVar3[(int)uVar2].m_backend);
          }
          local_210 = 0x1c00000000;
          local_288._0_16_ = (undefined1  [16])0x0;
          local_288._16_16_ = (undefined1  [16])0x0;
          local_268 = (undefined1  [16])0x0;
          local_258 = (undefined1  [16])0x0;
          local_248 = (undefined1  [16])0x0;
          local_238 = (undefined1  [16])0x0;
          local_228 = SUB1613((undefined1  [16])0x0,0);
          uStack_21b = 0;
          iStack_218 = 0;
          bStack_214 = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)local_288,
                     (cpp_dec_float<200U,_int,_void> *)local_1d8,&local_b0);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_288;
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_138;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar24 * -8 + 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar24 * -8 + 4);
          }
          iStack_c8 = iStack_218;
          bStack_c4 = bStack_214;
          local_c0 = local_210;
          uVar11 = local_210;
          if (((int)local_210 == 2) || ((max->m_backend).fpclass == cpp_dec_float_NaN))
          goto LAB_005bd811;
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_138,&max->m_backend);
          if (0 < iVar7) goto LAB_005bd80e;
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_138;
          pnVar14 = local_200;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar14->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar24 * -8 + 4);
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar24 * -2 + 1) * 4);
          }
          (local_200->m_backend).exp = iStack_c8;
          (local_200->m_backend).neg = bStack_c4;
          (local_200->m_backend).fpclass = (fpclass_type)local_c0;
          (local_200->m_backend).prec_elem = local_c0._4_4_;
          (stab->m_backend).data._M_elems[0] = local_b0.data._M_elems[0];
          puVar17 = local_b0.data._M_elems + 1;
          puVar19 = local_150;
          for (lVar10 = 0x1b; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar19 = *puVar17;
            puVar17 = puVar17 + (ulong)bVar24 * -2 + 1;
            puVar19 = puVar19 + (ulong)bVar24 * -2 + 1;
          }
          (stab->m_backend).exp = local_b0.exp;
          (stab->m_backend).neg =
               (bool)((local_b0.data._M_elems[0] != 0 || local_b0.fpclass != cpp_dec_float_finite) ^
                     local_b0.neg);
          (stab->m_backend).fpclass = local_b0.fpclass;
          (stab->m_backend).prec_elem = local_b0.prec_elem;
          local_2b4 = uVar2;
        }
      }
      else {
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_b0,&stab->m_backend);
        if (iVar7 < 1) {
          fVar9 = (stab->m_backend).fpclass;
          goto LAB_005bd44f;
        }
        pcVar16 = &local_1f0[(int)uVar2].m_backend;
        local_160._0_4_ = cpp_dec_float_finite;
        local_160._4_4_ = 0x1c;
        local_1d8 = (undefined1  [16])0x0;
        local_1c8 = (undefined1  [16])0x0;
        local_1b8 = (undefined1  [16])0x0;
        local_1a8 = (undefined1  [16])0x0;
        local_198 = (undefined1  [16])0x0;
        local_188 = (undefined1  [16])0x0;
        local_178 = SUB1613((undefined1  [16])0x0,0);
        uStack_16b = 0;
        iStack_168 = 0;
        bStack_164 = false;
        if ((cpp_dec_float<200U,_int,_void> *)local_1d8 == &pnVar3[(int)uVar2].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_1d8,pcVar16);
          if (local_1d8._0_4_ != 0 || (fpclass_type)local_160 != cpp_dec_float_finite) {
            bStack_164 = (bool)(bStack_164 ^ 1);
          }
        }
        else {
          if ((cpp_dec_float<200U,_int,_void> *)local_1d8 != pcVar16) {
            pcVar15 = pcVar16;
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar18->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar24 * -8 + 4);
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar24 * -8 + 4);
            }
            iStack_168 = pcVar16->exp;
            bStack_164 = pcVar16->neg;
            local_160._0_4_ = pcVar16->fpclass;
            local_160._4_4_ = pcVar16->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_1d8,&pnVar3[(int)uVar2].m_backend);
        }
        local_210 = 0x1c00000000;
        local_288._0_16_ = (undefined1  [16])0x0;
        local_288._16_16_ = (undefined1  [16])0x0;
        local_268 = (undefined1  [16])0x0;
        local_258 = (undefined1  [16])0x0;
        local_248 = (undefined1  [16])0x0;
        local_238 = (undefined1  [16])0x0;
        local_228 = SUB1613((undefined1  [16])0x0,0);
        uStack_21b = 0;
        iStack_218 = 0;
        bStack_214 = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_288,
                   (cpp_dec_float<200U,_int,_void> *)local_1d8,&local_b0);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_288;
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_138;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar15->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar24 * -8 + 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar24 * -8 + 4);
        }
        iStack_c8 = iStack_218;
        bStack_c4 = bStack_214;
        local_c0 = local_210;
        uVar11 = local_210;
        if (((int)local_210 != 2) && ((max->m_backend).fpclass != cpp_dec_float_NaN)) {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_138,&max->m_backend);
          if (iVar7 < 1) {
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_138;
            pnVar14 = local_200;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar24 * -8 + 4);
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar24 * -2 + 1) * 4);
            }
            (local_200->m_backend).exp = iStack_c8;
            (local_200->m_backend).neg = bStack_c4;
            (local_200->m_backend).fpclass = (fpclass_type)local_c0;
            (local_200->m_backend).prec_elem = local_c0._4_4_;
            pcVar16 = &local_b0;
            pnVar14 = stab;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar16 + ((ulong)bVar24 * -2 + 1) * 4);
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar24 * -2 + 1) * 4);
            }
            (stab->m_backend).exp = local_b0.exp;
            (stab->m_backend).neg = local_b0.neg;
            (stab->m_backend).fpclass = local_b0.fpclass;
            (stab->m_backend).prec_elem = local_b0.prec_elem;
            local_2b4 = uVar2;
            goto LAB_005bd906;
          }
LAB_005bd80e:
          uVar11 = (ulong)(fpclass_type)local_c0;
        }
LAB_005bd811:
        pcVar16 = local_1e8;
        if ((((int)uVar11 != 2) && (local_1e8->fpclass != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_138,local_1e8), 0 < iVar7)) {
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_138;
          pcVar18 = pcVar16;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar18->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar24 * -8 + 4);
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar24 * -8 + 4);
          }
          pcVar16->exp = iStack_c8;
          pcVar16->neg = bStack_c4;
          pcVar16->fpclass = (fpclass_type)local_c0;
          pcVar16->prec_elem = local_c0._4_4_;
          local_2b0 = uVar2;
        }
      }
    }
LAB_005bd906:
    puVar21 = (uint *)((long)puVar21 + local_148);
  } while (puVar21 < local_140);
  if ((int)local_2b0 < 1 || -1 < (int)local_2b4) {
    return local_2b4;
  }
  uVar11 = (ulong)local_2b0;
  if (pnVar22[uVar11].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_005bda21:
    pcVar15 = &pnVar3[uVar11].m_backend;
    pcVar16 = &local_1f8[uVar11].m_backend;
    local_210._0_4_ = cpp_dec_float_finite;
    local_210._4_4_ = 0x1c;
    local_288._0_16_ = (undefined1  [16])0x0;
    local_288._16_16_ = (undefined1  [16])0x0;
    local_268 = (undefined1  [16])0x0;
    local_258 = (undefined1  [16])0x0;
    local_248 = (undefined1  [16])0x0;
    local_238 = (undefined1  [16])0x0;
    local_228 = SUB1613((undefined1  [16])0x0,0);
    uStack_21b = 0;
    iStack_218 = 0;
    bStack_214 = false;
    if ((cpp_dec_float<200U,_int,_void> *)local_288 == pcVar16) {
LAB_005bdae5:
      local_210._0_4_ = cpp_dec_float_finite;
      local_210._4_4_ = 0x1c;
      bStack_214 = false;
      iStack_218 = 0;
      uStack_21b = 0;
      local_228 = SUB1613((undefined1  [16])0x0,0);
      local_238 = (undefined1  [16])0x0;
      local_248 = (undefined1  [16])0x0;
      local_258 = (undefined1  [16])0x0;
      local_268 = (undefined1  [16])0x0;
      local_288._16_16_ = (undefined1  [16])0x0;
      local_288._0_16_ = (undefined1  [16])0x0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                ((cpp_dec_float<200U,_int,_void> *)local_288,pcVar15);
      if (local_288._0_4_ != 0 || (fpclass_type)local_210 != cpp_dec_float_finite) {
        bStack_214 = (bool)(bStack_214 ^ 1);
      }
      goto LAB_005bdb0d;
    }
    if ((cpp_dec_float<200U,_int,_void> *)local_288 != pcVar15) {
      pcVar18 = pcVar15;
      pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_288;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar20->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar24 * -8 + 4);
        pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar24 * -8 + 4);
      }
      iStack_218 = pcVar15->exp;
      bStack_214 = pcVar15->neg;
      local_210._0_4_ = pcVar15->fpclass;
      local_210._4_4_ = pcVar15->prec_elem;
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<200U,_int,_void> *)local_288,0,(type *)0x0);
    iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&pnVar22[uVar11].m_backend,(cpp_dec_float<200U,_int,_void> *)local_288);
    if (iVar7 < 1) goto LAB_005bda21;
    pcVar15 = &local_1f0[uVar11].m_backend;
    pcVar16 = &pnVar3[uVar11].m_backend;
    local_210._0_4_ = cpp_dec_float_finite;
    local_210._4_4_ = 0x1c;
    local_288._0_16_ = (undefined1  [16])0x0;
    local_288._16_16_ = (undefined1  [16])0x0;
    local_268 = (undefined1  [16])0x0;
    local_258 = (undefined1  [16])0x0;
    local_248 = (undefined1  [16])0x0;
    local_238 = (undefined1  [16])0x0;
    local_228 = SUB1613((undefined1  [16])0x0,0);
    uStack_21b = 0;
    iStack_218 = 0;
    bStack_214 = false;
    if ((cpp_dec_float<200U,_int,_void> *)local_288 == pcVar16) goto LAB_005bdae5;
    if ((cpp_dec_float<200U,_int,_void> *)local_288 != pcVar15) {
      pcVar18 = pcVar15;
      puVar21 = (uint *)local_288;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar21 = (pcVar18->data)._M_elems[0];
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar24 * -8 + 4);
        puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
      }
      iStack_218 = pcVar15->exp;
      bStack_214 = pcVar15->neg;
      local_210._0_4_ = pcVar15->fpclass;
      local_210._4_4_ = pcVar15->prec_elem;
    }
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            ((cpp_dec_float<200U,_int,_void> *)local_288,pcVar16);
LAB_005bdb0d:
  puVar21 = (uint *)local_288;
  pnVar14 = bestDelta;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pnVar14->m_backend).data._M_elems[0] = *puVar21;
    puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar24 * -2 + 1) * 4);
  }
  (bestDelta->m_backend).exp = iStack_218;
  (bestDelta->m_backend).neg = bStack_214;
  (bestDelta->m_backend).fpclass = (fpclass_type)local_210;
  (bestDelta->m_backend).prec_elem = local_210._4_4_;
  return local_2b4;
}

Assistant:

int SPxFastRT<R>::maxSelect(
   R& val,
   R& stab,
   R& best,
   R& bestDelta,
   R max,
   const UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i;
   R x, y;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();
   const int* last = idx + update.delta().size();

   int nr = -1;
   int bestNr = -1;

   for(idx += start; idx < last; idx += incr)
   {
      i = *idx;
      x = upd[i];

      // in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables
      if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                     && this->thesolver->isBasic(i))))
         continue;

      if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
            && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
            == SPxBasisBase<R>::Desc::P_FIXED)
         continue;

      if(x > stab)
      {
         y = (up[i] - vec[i]) / x;

         if(y <= max)
         {
            val = y;
            nr = i;
            stab = x;
         }
         else if(y > best)
         {
            best = y;
            bestNr = i;
         }
      }
      else if(x < -stab)
      {
         y = (low[i] - vec[i]) / x;

         if(y <= max)
         {
            val = y;
            nr = i;
            stab = -x;
         }
         else if(y > best)
         {
            best = y;
            bestNr = i;
         }
      }
   }

   if(nr < 0 && bestNr > 0)
   {
      if(upd[bestNr] > 0)
         bestDelta = up[bestNr] - vec[bestNr];
      else
         bestDelta = vec[bestNr] - low[bestNr];
   }

   return nr;
}